

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_handle_error_pdu(rtr_socket *rtr_socket,void *buf)

{
  uint uVar1;
  long lVar2;
  long in_FS_OFFSET;
  char *pdu_txt;
  uint32_t len_err_txt;
  pdu_error *pdu;
  void *buf_local;
  rtr_socket *rtr_socket_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR Socket: Error PDU received");
  switch(*(undefined2 *)((long)buf + 2)) {
  case 0:
    lrtr_dbg("RTR Socket: Corrupt data received");
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    break;
  case 1:
    lrtr_dbg("RTR Socket: Internal error on server-side");
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    break;
  case 2:
    lrtr_dbg("RTR Socket: No data available");
    rtr_change_socket_state(rtr_socket,RTR_ERROR_NO_DATA_AVAIL);
    break;
  case 3:
    lrtr_dbg("RTR Socket: Invalid request from client");
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    break;
  case 4:
    lrtr_dbg("RTR Socket: Client uses unsupported protocol version");
    if ((*buf < 3) && ((uint)*buf < rtr_socket->version)) {
      lrtr_dbg("RTR Socket: Downgrading from %i to version %i",(ulong)rtr_socket->version,
               (ulong)*buf);
      rtr_socket->version = (uint)*buf;
      rtr_change_socket_state(rtr_socket,RTR_FAST_RECONNECT);
    }
    else {
      lrtr_dbg("RTR Socket: Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i"
               ,(ulong)rtr_socket->version,(ulong)*buf);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    }
    break;
  case 5:
    lrtr_dbg("RTR Socket: Client set unsupported PDU type");
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    break;
  default:
    lrtr_dbg("RTR Socket: error unknown, server sent unsupported error code %u",
             (ulong)*(ushort *)((long)buf + 2));
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
  }
  uVar1 = *(uint *)((long)buf + (ulong)*(uint *)((long)buf + 8) + 0xc);
  if (uVar1 != 0) {
    if ((ulong)*(uint *)((long)buf + 8) + 0x10 + (ulong)uVar1 == (ulong)*(uint *)((long)buf + 4)) {
      lrtr_dbg("RTR Socket: Error PDU included the following error msg: \'%.*s\'",(ulong)uVar1,
               (long)buf + (ulong)*(uint *)((long)buf + 8) + 0x10);
    }
    else {
      lrtr_dbg("RTR Socket: error: Length of error text contains an incorrect value");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_handle_error_pdu(struct rtr_socket *rtr_socket, const void *buf)
{
	RTR_DBG1("Error PDU received"); // TODO: append server ip & port
	const struct pdu_error *pdu = buf;

	switch (pdu->error_code) {
	case CORRUPT_DATA:
		RTR_DBG1("Corrupt data received");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case INTERNAL_ERROR:
		RTR_DBG1("Internal error on server-side");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case NO_DATA_AVAIL:
		RTR_DBG1("No data available");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_NO_DATA_AVAIL);
		break;
	case INVALID_REQUEST:
		RTR_DBG1("Invalid request from client");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case UNSUPPORTED_PROTOCOL_VER:
		RTR_DBG1("Client uses unsupported protocol version");
		if (pdu->ver <= RTR_PROTOCOL_MAX_SUPPORTED_VERSION && pdu->ver >= RTR_PROTOCOL_MIN_SUPPORTED_VERSION &&
		    pdu->ver < rtr_socket->version) {
			RTR_DBG("Downgrading from %i to version %i", rtr_socket->version, pdu->ver);
			rtr_socket->version = pdu->ver;
			rtr_change_socket_state(rtr_socket, RTR_FAST_RECONNECT);
		} else {
			RTR_DBG("Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i",
				rtr_socket->version, pdu->ver);
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		}
		break;
	case UNSUPPORTED_PDU_TYPE:
		RTR_DBG1("Client set unsupported PDU type");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	default:
		RTR_DBG("error unknown, server sent unsupported error code %u", pdu->error_code);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	}

	const uint32_t len_err_txt = *((uint32_t *)(pdu->rest + pdu->len_enc_pdu));

	if (len_err_txt > 0) {
		if ((sizeof(pdu->ver) + sizeof(pdu->type) + sizeof(pdu->error_code) + sizeof(pdu->len) +
		     sizeof(pdu->len_enc_pdu) + pdu->len_enc_pdu + 4 + len_err_txt) != pdu->len) {
			RTR_DBG1("error: Length of error text contains an incorrect value");
		} else {
			char *pdu_txt = (char *)pdu->rest + pdu->len_enc_pdu + sizeof(len_err_txt);

			RTR_DBG("Error PDU included the following error msg: \'%.*s\'", len_err_txt, pdu_txt);
		}
	}

	return RTR_SUCCESS;
}